

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viface.cpp
# Opt level: O0

void __thiscall viface::VIfaceImpl::setIPv4Broadcast(VIfaceImpl *this,string *broadcast)

{
  int iVar1;
  char *__cp;
  ostream *poVar2;
  invalid_argument *this_00;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream what;
  undefined1 local_1c [4];
  string *psStack_18;
  in_addr addr;
  string *broadcast_local;
  VIfaceImpl *this_local;
  
  psStack_18 = broadcast;
  __cp = (char *)std::__cxx11::string::c_str();
  iVar1 = inet_pton(2,__cp,local_1c);
  if (iVar1 == 0) {
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar2 = std::operator<<((ostream *)local_198,"--- Invalid IPv4 address (");
    poVar2 = std::operator<<(poVar2,(string *)broadcast);
    std::operator<<(poVar2,") for ");
    poVar2 = std::operator<<((ostream *)local_198,(string *)&this->name);
    poVar2 = std::operator<<(poVar2,".");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::invalid_argument::invalid_argument(this_00,local_1c8);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::__cxx11::string::operator=((string *)&this->broadcast,(string *)broadcast);
  return;
}

Assistant:

void VIfaceImpl::setIPv4Broadcast(string broadcast)
{
    // Validate format
    struct in_addr addr;

    if (!inet_pton(AF_INET, broadcast.c_str(), &addr)) {
        ostringstream what;
        what << "--- Invalid IPv4 address (" << broadcast << ") for ";
        what << this->name << "." << endl;
        throw invalid_argument(what.str());
    }

    this->broadcast = broadcast;
    return;
}